

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O3

Mat * ncc(Mat *in1,Mat *in2,string *type,bool add_constant)

{
  long lVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  pointer pdVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  _InputArray *p_Var9;
  undefined7 in_register_00000009;
  char *pcVar10;
  size_type __n;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  char in_R8B;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 local_270 [8];
  Mat depth;
  pointer pdStack_260;
  long *local_228;
  Mat local_210 [8];
  Mat left;
  long local_200;
  long *local_1c8;
  Mat local_1b0 [8];
  Mat right;
  long local_1a0;
  long *local_168;
  _InputArray local_150;
  long local_138;
  undefined1 local_130 [8];
  vector<double,_std::allocator<double>_> tmp;
  long *local_e8;
  pointer pvStack_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  max_ncc;
  long local_40;
  allocator_type local_35;
  int local_34;
  
  pcVar10 = (char *)CONCAT71(in_register_00000009,add_constant);
  uVar3 = (*(uint **)(in2 + 0x40))[1];
  __n = (size_type)(int)uVar3;
  uVar4 = **(uint **)(in2 + 0x40);
  uVar20 = (ulong)uVar4;
  bgr_to_grey(local_210);
  bgr_to_grey(local_1b0);
  if (in_R8B != '\0') {
    max_ncc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_270;
    local_270 = (undefined1  [8])0x4024000000000000;
    _depth = (pointer)0x0;
    pdStack_260 = (pointer)0x0;
    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_130._0_4_ = 0x1010000;
    local_150.obj = local_1b0;
    pvStack_98 = (pointer)CONCAT44(pvStack_98._4_4_,-0x3efdfffa);
    max_ncc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x400000001;
    local_150.sz.width = 0;
    local_150.sz.height = 0;
    local_150.flags = -0x3dff0000;
    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_150.obj;
    p_Var9 = (_InputArray *)cv::noArray();
    cv::add((_InputArray *)local_130,(_InputArray *)&pvStack_98,(_OutputArray *)&local_150,p_Var9,-1
           );
  }
  cv::Mat::Mat((Mat *)local_270,uVar4,uVar3,0);
  pvStack_98 = (pointer)0x0;
  max_ncc.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  max_ncc.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < (int)uVar4) {
    uVar11 = uVar20;
    do {
      local_150.flags = 0;
      local_150._4_4_ = 0xc0000000;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_130,__n,
                 (value_type_conflict2 *)&local_150,&local_35);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&pvStack_98,(vector<double,_std::allocator<double>_> *)local_130);
      if ((void *)CONCAT44(local_130._4_4_,local_130._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_130._4_4_,local_130._0_4_));
      }
      uVar19 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar19;
    } while (uVar19 != 0);
  }
  uVar19 = uVar3 - 1;
  local_138 = -(ulong)uVar3;
  local_40 = 1;
  max_ncc.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar19;
  do {
    cv::Mat::Mat((Mat *)local_130,uVar4,uVar3,0);
    iVar7 = std::__cxx11::string::compare(pcVar10);
    if (iVar7 == 0) {
      if (0 < (int)uVar4) {
        uVar11 = 0;
        do {
          lVar13 = 0;
          do {
            *(undefined1 *)
             ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + lVar13 + *local_e8 * uVar11) =
                 *(undefined1 *)(lVar13 + *local_168 * uVar11 + local_1a0);
            lVar13 = lVar13 + 1;
          } while (local_40 != lVar13);
          if (local_40 < (long)__n) {
            lVar13 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar13 + local_40 + *local_e8 * uVar11) =
                   *(undefined1 *)(lVar13 + *local_168 * uVar11 + local_1a0);
              lVar13 = lVar13 + 1;
            } while (local_138 + local_40 + lVar13 != 0);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar20);
LAB_001042e4:
        if (0 < (int)uVar4) {
          uVar11 = 0;
          do {
            uVar12 = 3;
            if (3 < (int)uVar11) {
              uVar12 = uVar11 & 0xffffffff;
            }
            if (0 < (int)uVar3) {
              lVar13 = uVar12 - 3;
              iVar7 = (int)uVar12 + -3;
              local_34 = (int)uVar11 + 3;
              if ((int)(uVar4 - 1) <= local_34) {
                local_34 = uVar4 - 1;
              }
              max_ncc.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_34 - iVar7;
              lVar21 = (long)local_34;
              uVar12 = 0;
              do {
                uVar18 = 3;
                if (3 < (int)uVar12) {
                  uVar18 = uVar12 & 0xffffffff;
                }
                lVar1 = uVar18 - 4;
                iVar17 = (int)uVar18 + -3;
                uVar14 = (int)uVar12 + 3;
                if ((int)max_ncc.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <= (int)uVar14) {
                  uVar14 = max_ncc.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                }
                dVar23 = (double)(int)((uVar14 - iVar17) *
                                      (int)max_ncc.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar8 = std::__cxx11::string::compare(pcVar10);
                dVar28 = 0.0;
                dVar25 = 0.0;
                dVar29 = 0.0;
                if (iVar8 == 0) {
                  if (iVar7 <= local_34) {
                    dVar22 = 0.0;
                    dVar24 = 0.0;
                    lVar15 = lVar13;
                    do {
                      if (iVar17 <= (int)uVar14) {
                        lVar16 = lVar1;
                        do {
                          dVar24 = dVar24 + (double)*(byte *)(*local_1c8 * lVar15 + local_200 + 1 +
                                                             lVar16);
                          dVar22 = dVar22 + (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar16 + *local_e8 * lVar15 + 1);
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < (int)uVar14);
                      }
                      bVar6 = lVar15 < lVar21;
                      lVar15 = lVar15 + 1;
                    } while (bVar6);
                    dVar28 = 0.0;
                    dVar25 = 0.0;
                    dVar29 = 0.0;
                    if (iVar7 <= local_34) {
                      lVar15 = lVar13;
                      dVar25 = 0.0;
                      do {
                        if (iVar17 <= (int)uVar14) {
                          lVar16 = lVar1;
                          do {
                            dVar26 = (double)*(byte *)(*local_1c8 * lVar15 + local_200 + 1 + lVar16)
                                     - dVar24 / dVar23;
                            dVar25 = dVar25 + dVar26 * dVar26;
                            dVar27 = (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar16 + *local_e8 * lVar15 + 1) - dVar22 / dVar23
                            ;
                            dVar29 = dVar29 + dVar27 * dVar27;
                            dVar28 = dVar28 + dVar26 * dVar27;
                            lVar16 = lVar16 + 1;
                          } while (lVar16 < (int)uVar14);
                        }
                        bVar6 = lVar15 < lVar21;
                        lVar15 = lVar15 + 1;
                      } while (bVar6);
                    }
                  }
                }
                else if (iVar7 <= local_34) {
                  dVar22 = 0.0;
                  dVar24 = 0.0;
                  lVar15 = lVar13;
                  do {
                    if (iVar17 <= (int)uVar14) {
                      lVar16 = lVar1;
                      do {
                        dVar24 = dVar24 + (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar16 + *local_e8 * lVar15 + 1);
                        dVar22 = dVar22 + (double)*(byte *)(*local_168 * lVar15 + local_1a0 + 1 +
                                                           lVar16);
                        lVar16 = lVar16 + 1;
                      } while (lVar16 < (int)uVar14);
                    }
                    bVar6 = lVar15 < lVar21;
                    lVar15 = lVar15 + 1;
                  } while (bVar6);
                  dVar28 = 0.0;
                  dVar25 = 0.0;
                  dVar29 = 0.0;
                  if (iVar7 <= local_34) {
                    lVar15 = lVar13;
                    do {
                      if (iVar17 <= (int)uVar14) {
                        lVar16 = lVar1;
                        do {
                          dVar26 = (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar16 + *local_e8 * lVar15 + 1) - dVar24 / dVar23
                          ;
                          dVar25 = dVar25 + dVar26 * dVar26;
                          dVar27 = (double)*(byte *)(*local_168 * lVar15 + local_1a0 + 1 + lVar16) -
                                   dVar22 / dVar23;
                          dVar29 = dVar29 + dVar27 * dVar27;
                          dVar28 = dVar28 + dVar26 * dVar27;
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < (int)uVar14);
                      }
                      bVar6 = lVar15 < lVar21;
                      lVar15 = lVar15 + 1;
                    } while (bVar6);
                  }
                }
                dVar25 = dVar25 / dVar23;
                if (dVar25 < 0.0) {
                  dVar25 = sqrt(dVar25);
                }
                else {
                  dVar25 = SQRT(dVar25);
                }
                dVar29 = dVar29 / dVar23;
                if (dVar29 < 0.0) {
                  dVar29 = sqrt(dVar29);
                }
                else {
                  dVar29 = SQRT(dVar29);
                }
                dVar23 = ((dVar28 / dVar23) / (dVar25 * dVar29)) / dVar23;
                pdVar5 = pvStack_98[uVar11].super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                pdVar2 = pdVar5 + uVar12;
                if (*pdVar2 <= dVar23 && dVar23 != *pdVar2) {
                  pdVar5[uVar12] = dVar23;
                  *(char *)((long)pdStack_260 + uVar12 + *local_228 * uVar11) =
                       (char)local_40 * '\x03';
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != __n);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar20);
        }
      }
    }
    else {
      iVar7 = std::__cxx11::string::compare(pcVar10);
      if (iVar7 != 0) {
        cv::Mat::Mat(in1,0,0,0);
        cv::Mat::~Mat((Mat *)local_130);
        goto LAB_00104780;
      }
      if (0 < (int)uVar4) {
        uVar11 = 0;
        do {
          lVar13 = (long)(int)uVar19;
          if (local_40 < (long)__n) {
            uVar12 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + uVar12 + *local_e8 * uVar11) =
                   *(undefined1 *)(uVar12 + *local_1c8 * uVar11 + local_200 + local_40);
              uVar12 = uVar12 + 1;
            } while (uVar19 != uVar12);
          }
          do {
            *(undefined1 *)
             ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + lVar13 + *local_e8 * uVar11) =
                 *(undefined1 *)(lVar13 + *local_1c8 * uVar11 + local_200);
            lVar13 = lVar13 + 1;
          } while (lVar13 < (long)__n);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar20);
        goto LAB_001042e4;
      }
    }
    cv::Mat::~Mat((Mat *)local_130);
    local_40 = local_40 + 1;
    uVar19 = uVar19 - 1;
  } while (local_40 != 0x50);
  cv::Mat::Mat(in1,(Mat *)local_270);
LAB_00104780:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&pvStack_98);
  cv::Mat::~Mat((Mat *)local_270);
  cv::Mat::~Mat(local_1b0);
  cv::Mat::~Mat(local_210);
  return in1;
}

Assistant:

Mat
ncc(Mat in1, Mat in2, string type, bool add_constant=false)
{
    int width = in1.size().width;
    int height = in1.size().height;
    int max_offset = 79;
    int kernel_size = 3; // window size

    Mat left = bgr_to_grey(in1);
    Mat right = bgr_to_grey(in2);

    if (add_constant)
    {
        right += 10;
    }

    Mat depth(height, width, 0);
    vector< vector<double> > max_ncc; // store max NCC value

    for (int i = 0; i < height; ++i)
    {
        vector<double> tmp(width, -2);
        max_ncc.push_back(tmp);
    }

    for (int offset = 1; offset <= max_offset; offset++)
    {
        Mat tmp(height, width, 0);
        // shift image depend on type to save calculation time
        if (type == "left")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < offset; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x);
                }

                for (int x = offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x - offset);
                }
            }
        }
        else if (type == "right")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < width - offset; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x + offset);
                }

                for (int x = width - offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x);
                }
            }
        }
        else
        {
            Mat tmp(0, 0, 0);
            return tmp;
        }

        // calculate each pixel's NCC value
        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                int start_x = max(0, x - kernel_size);
                int start_y = max(0, y - kernel_size);
                int end_x = min(width - 1, x + kernel_size);
                int end_y = min(height - 1, y + kernel_size);
                double n = (end_y - start_y) * (end_x - start_x);
                double res_ncc = 0;

                if (type == "left")
                {
                    double left_mean = 0, right_mean = 0;
                    double left_std = 0, right_std = 0;
                    double numerator = 0;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_mean += left.at<uchar>(i, j);
                            right_mean += tmp.at<uchar>(i, j);
                        }
                    }

                    left_mean /= n;
                    right_mean /= n;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_std += pow(left.at<uchar>(i, j) - left_mean, 2);
                            right_std += pow(tmp.at<uchar>(i, j) - right_mean, 2);
                            numerator += (left.at<uchar>(i, j) - left_mean) * (tmp.at<uchar>(i, j) - right_mean);
                        }
                    }

                    numerator /= n;
                    left_std /= n;
                    right_std /= n;
                    res_ncc = numerator / (sqrt(left_std) * sqrt(right_std)) / n;
                }
                else
                {
                    double left_mean = 0, right_mean = 0;
                    double left_std = 0, right_std = 0;
                    double numerator = 0;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_mean += tmp.at<uchar>(i, j);
                            right_mean += right.at<uchar>(i, j);
                        }
                    }

                    left_mean /= n;
                    right_mean /= n;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_std += pow(tmp.at<uchar>(i, j) - left_mean, 2);
                            right_std += pow(right.at<uchar>(i, j) - right_mean, 2);
                            numerator += (tmp.at<uchar>(i, j) - left_mean) * (right.at<uchar>(i, j) - right_mean);
                        }
                    }

                    numerator /= n;
                    left_std /= n;
                    right_std /= n;
                    res_ncc = numerator / (sqrt(left_std) * sqrt(right_std)) / n;
                }

                // greater NCC value found
                if (res_ncc > max_ncc[y][x])
                {
                    max_ncc[y][x] = res_ncc;
                    // for better visualization
                    depth.at<uchar>(y, x) = (uchar)(offset * 3);
                }
            }
        }
    }

    return depth;
}